

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O1

vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> * __thiscall
fasttext::Meter::scoreVsTrue
          (vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
           *__return_storage_ptr__,Meter *this,int32_t labelId)

{
  unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
  *this_00;
  pointer ppVar1;
  pointer ppVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
  *__range2;
  __node_base *p_Var5;
  int32_t local_1c;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->labelMetrics_;
  local_1c = labelId;
  if (labelId == -1) {
    p_Var5 = &(this->labelMetrics_)._M_h._M_before_begin;
    while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
      pmVar4 = std::__detail::
               _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)this_00,(key_type *)(p_Var5 + 1));
      std::vector<std::pair<float,float>,std::allocator<std::pair<float,float>>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::pair<float,float>*,std::vector<std::pair<float,float>,std::allocator<std::pair<float,float>>>>>
                ((vector<std::pair<float,float>,std::allocator<std::pair<float,float>>> *)
                 __return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
                 (pmVar4->scoreVsTrue).
                 super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (pmVar4->scoreVsTrue).
                 super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  else {
    sVar3 = std::
            _Hashtable<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(&this_00->_M_h,&local_1c);
    if (sVar3 != 0) {
      pmVar4 = std::__detail::
               _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)this_00,&local_1c);
      std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::operator=
                (__return_storage_ptr__,&pmVar4->scoreVsTrue);
    }
  }
  ppVar1 = (__return_storage_ptr__->
           super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (__return_storage_ptr__->
           super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (ppVar1 != ppVar2) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<float,float>*,std::vector<std::pair<float,float>,std::allocator<std::pair<float,float>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar1,ppVar2,(int)LZCOUNT((long)ppVar2 - (long)ppVar1 >> 3) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<float,float>*,std::vector<std::pair<float,float>,std::allocator<std::pair<float,float>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar1,ppVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<real, real>> Meter::scoreVsTrue(int32_t labelId) const {
  std::vector<std::pair<real, real>> ret;
  if (labelId == kAllLabels) {
    for (const auto& k : labelMetrics_) {
      auto& labelScoreVsTrue = labelMetrics_.at(k.first).scoreVsTrue;
      ret.insert(ret.end(), labelScoreVsTrue.begin(), labelScoreVsTrue.end());
    }
  } else {
    if (labelMetrics_.count(labelId)) {
      ret = labelMetrics_.at(labelId).scoreVsTrue;
    }
  }
  sort(ret.begin(), ret.end());

  return ret;
}